

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane_mixer.c
# Opt level: O1

void calculate_pitch_shift(space_source *source,space_mixer_data *listener)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar3 = listener->doppler_factor;
  if (fVar3 <= 0.0) {
    fVar3 = 1.0;
  }
  else {
    fVar6 = listener->location[0] - source->location[0];
    fVar7 = listener->location[1] - source->location[1];
    fVar5 = listener->location[2] - source->location[2];
    fVar2 = listener->soundspeed;
    fVar1 = fVar5 * fVar5 + fVar6 * fVar6 + fVar7 * fVar7;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar4 = (listener->velocity[2] * fVar5 +
            listener->velocity[0] * fVar6 + listener->velocity[1] * fVar7) * fVar1;
    fVar1 = (fVar5 * source->velocity[2] + fVar6 * source->velocity[0] + fVar7 * source->velocity[1]
            ) * fVar1;
    fVar5 = fVar2 / fVar3;
    if (fVar5 <= fVar1) {
      fVar1 = fVar5;
    }
    if (fVar5 <= fVar4) {
      fVar4 = fVar5;
    }
    fVar2 = (fVar2 - fVar4 * fVar3) / (fVar2 - fVar1 * fVar3);
    fVar3 = 0.5;
    if ((0.5 <= fVar2) && (fVar3 = 2.0, fVar2 < 2.0)) {
      fVar3 = fVar2;
    }
  }
  source->pitch = fVar3;
  return;
}

Assistant:

VECTORIZE static inline float calculate_pitch_shift(struct plane_mixer_data *listener, struct plane_source *source){
  if(listener->doppler_factor <= 0.0) return 1.0;
  // See OpenAL1.1 specification §3.5.2
  float SL[2] = {listener->location[0] - source->location[0],
                 listener->location[1] - source->location[1]};
  float *SV = source->velocity;
  float *LV = listener->velocity;
  float SS = listener->soundspeed;
  float DF = listener->doppler_factor;
  float Mag = mag(SL);
  float vls = dot(SL, LV) * Mag;
  float vss = dot(SL, SV) * Mag;
  float SS_DF = SS/DF;
  vss = min(vss, SS_DF);
  vls = min(vls, SS_DF);
  return (SS - DF*vls) / (SS - DF*vss);
}